

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack3_16(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  
  uVar1 = *(ulong *)in;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4 = vpshufd_avx(auVar4,0x54);
  *out = (uint)uVar1 & 7;
  auVar5 = vpbroadcastd_avx512vl();
  auVar5 = vpsrlvd_avx2(auVar5,_DAT_001a5280);
  auVar6._8_4_ = 7;
  auVar6._0_8_ = 0x700000007;
  auVar6._12_4_ = 7;
  auVar7._16_4_ = 7;
  auVar7._0_16_ = auVar6;
  auVar7._20_4_ = 7;
  auVar7._24_4_ = 7;
  auVar7._28_4_ = 7;
  auVar5 = vpand_avx2(auVar5,auVar7);
  *(undefined1 (*) [32])(out + 1) = auVar5;
  out[9] = (uint)uVar1 >> 0x1b & 7;
  auVar3 = vpsrlvd_avx2(auVar4,_DAT_001aa370);
  auVar4 = vpinsrd_avx(auVar6,(int)(uVar1 >> 0x20) * 4 & 4,0);
  auVar2 = vpor_avx(auVar3,auVar4);
  auVar4 = vpand_avx(auVar3,auVar6);
  auVar4 = vpblendd_avx2(auVar4,auVar2,1);
  *(undefined1 (*) [16])(out + 10) = auVar4;
  auVar4 = vpbroadcastd_avx512vl();
  auVar4 = vpsrlvd_avx2(auVar4,_DAT_001aa380);
  auVar4 = vpand_avx(auVar4,auVar6);
  *(long *)(out + 0xe) = auVar4._0_8_;
  return in + 2;
}

Assistant:

const uint32_t *__fastunpack3_16(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 3);
  out++;
  *out = ((*in) >> 3) % (1U << 3);
  out++;
  *out = ((*in) >> 6) % (1U << 3);
  out++;
  *out = ((*in) >> 9) % (1U << 3);
  out++;
  *out = ((*in) >> 12) % (1U << 3);
  out++;
  *out = ((*in) >> 15) % (1U << 3);
  out++;
  *out = ((*in) >> 18) % (1U << 3);
  out++;
  *out = ((*in) >> 21) % (1U << 3);
  out++;
  *out = ((*in) >> 24) % (1U << 3);
  out++;
  *out = ((*in) >> 27) % (1U << 3);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 1)) << (3 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 3);
  out++;
  *out = ((*in) >> 4) % (1U << 3);
  out++;
  *out = ((*in) >> 7) % (1U << 3);
  out++;
  *out = ((*in) >> 10) % (1U << 3);
  out++;
  *out = ((*in) >> 13) % (1U << 3);
  out++;

  return in + 1;
}